

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<short,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_00
  ;
  longlong u2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  short t;
  longlong u;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffde2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffde4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffde6;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffde8;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  undefined4 in_stack_fffffffffffffdf0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdf4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdf6;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe02;
  undefined2 in_stack_fffffffffffffe04;
  undefined2 in_stack_fffffffffffffe06;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe08;
  short local_1a;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_e;
  byte local_b;
  short local_a;
  longlong local_8;
  
  local_8 = 0;
  local_a = 0;
  local_b = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long_long>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                 CONCAT24(in_stack_fffffffffffffde4.m_int,
                                          CONCAT22(in_stack_fffffffffffffde2,
                                                   in_stack_fffffffffffffde0))),
                     &in_stack_fffffffffffffdd8->m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_18,&local_8);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long_long>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                                 CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)
                                ),
                     (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)in_stack_fffffffffffffde8.m_int);
  local_b = (local_b ^ 0xff) & 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (short *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (longlong *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8);
  local_e.m_int = local_1a;
  SafeInt::operator_cast_to_long_long
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator*((longlong)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  SVar1.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  SVar1.m_int._0_4_ = in_stack_fffffffffffffdf0;
  SVar1.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,SVar1);
  local_8 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  rhs.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs);
  local_8 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator/(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  i.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  i.m_int._0_4_ = in_stack_fffffffffffffdf0;
  i.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,i);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator+((longlong)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  rhs_00.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_00.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_00);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  local_8 = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator-((longlong)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  rhs_01.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_01.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_01);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe06,
                         CONCAT24(in_stack_fffffffffffffe04,
                                  CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffe08);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator<<(in_stack_fffffffffffffdf6.m_int,in_stack_fffffffffffffdf8);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  bits.m_int._2_2_ = in_stack_fffffffffffffe02;
  bits.m_int._0_2_ = in_stack_fffffffffffffe00;
  bits.m_int._4_2_ = in_stack_fffffffffffffe04;
  bits.m_int._6_2_ = in_stack_fffffffffffffe06;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdf8.m_int,bits);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe06,
                         CONCAT24(in_stack_fffffffffffffe04,
                                  CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffe08);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator>>(in_stack_fffffffffffffdf6.m_int,in_stack_fffffffffffffdf8);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  bits_00.m_int._2_2_ = in_stack_fffffffffffffe02;
  bits_00.m_int._0_2_ = in_stack_fffffffffffffe00;
  bits_00.m_int._4_2_ = in_stack_fffffffffffffe04;
  bits_00.m_int._6_2_ = in_stack_fffffffffffffe06;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdf8.m_int,bits_00);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator&(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  rhs_02.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_02.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_02.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_02);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator|(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  rhs_03.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_03.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_03.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_03);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator^(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_short
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong)in_stack_fffffffffffffdd8);
  rhs_04.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_04.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_04.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_04);
  local_b = operator<(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator<(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8.m_int);
  local_b = operator<((longlong)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde6);
  local_b = operator<(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator<=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator<=(in_stack_fffffffffffffde6,(longlong)in_stack_fffffffffffffdd8);
  local_b = operator<=(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  local_b = operator<=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>(in_stack_fffffffffffffde6,(longlong)in_stack_fffffffffffffdd8);
  local_b = operator>(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  local_b = operator>(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8.m_int);
  local_b = operator>=((longlong)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde6);
  local_b = operator>=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  SVar1.m_int = local_18.m_int;
  lhs.m_int = local_e.m_int;
  local_b = operator==(local_e,local_18);
  local_b = operator==(local_e,(longlong)in_stack_fffffffffffffdd8);
  local_b = operator==((longlong)in_stack_fffffffffffffdd8,local_e);
  operator==(lhs,SVar1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}